

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall spirv_cross::CompilerGLSL::format_to_glsl(CompilerGLSL *this,ImageFormat format)

{
  bool bVar1;
  CompilerError *this_00;
  ImageFormat format_local;
  CompilerGLSL *this_local;
  
  if ((((this->options).es & 1U) != 0) && (bVar1 = Compiler::is_desktop_only_format(format), bVar1))
  {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Attempting to use image format not supported in ES profile.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(format) {
  default:
    this_local = (CompilerGLSL *)0x0;
    break;
  case ImageFormatRgba32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_6591ba;
    break;
  case ImageFormatRgba16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_6591c6;
    break;
  case ImageFormatR32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_6591d2;
    break;
  case ImageFormatRgba8:
    this_local = (CompilerGLSL *)anon_var_dwarf_6591de;
    break;
  case ImageFormatRgba8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_6591ea;
    break;
  case ImageFormatRg32f:
    this_local = (CompilerGLSL *)anon_var_dwarf_6591f6;
    break;
  case ImageFormatRg16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_659202;
    break;
  case ImageFormatR11fG11fB10f:
    this_local = (CompilerGLSL *)anon_var_dwarf_65929e;
    break;
  case ImageFormatR16f:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592aa;
    break;
  case ImageFormatRgba16:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592f2;
    break;
  case ImageFormatRgb10A2:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592b6;
    break;
  case ImageFormatRg16:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592e6;
    break;
  case ImageFormatRg8:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592ce;
    break;
  case ImageFormatR16:
    this_local = (CompilerGLSL *)0x58918c;
    break;
  case ImageFormatR8:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592c2;
    break;
  case ImageFormatRgba16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_659316;
    break;
  case ImageFormatRg16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_65930a;
    break;
  case ImageFormatRg8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_65932e;
    break;
  case ImageFormatR16Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_6592fe;
    break;
  case ImageFormatR8Snorm:
    this_local = (CompilerGLSL *)anon_var_dwarf_659322;
    break;
  case ImageFormatRgba32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_65920e;
    break;
  case ImageFormatRgba16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_65921a;
    break;
  case ImageFormatRgba8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_659232;
    break;
  case ImageFormatR32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_659226;
    break;
  case ImageFormatRg32i:
    this_local = (CompilerGLSL *)anon_var_dwarf_65923e;
    break;
  case ImageFormatRg16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_65924a;
    break;
  case ImageFormatRg8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_659376;
    break;
  case ImageFormatR16i:
    this_local = (CompilerGLSL *)anon_var_dwarf_659382;
    break;
  case ImageFormatR8i:
    this_local = (CompilerGLSL *)anon_var_dwarf_65936a;
    break;
  case ImageFormatRgba32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_659256;
    break;
  case ImageFormatRgba16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_659262;
    break;
  case ImageFormatRgba8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_65927a;
    break;
  case ImageFormatR32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_65926e;
    break;
  case ImageFormatRgb10a2ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_65935e;
    break;
  case ImageFormatRg32ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_659286;
    break;
  case ImageFormatRg16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_659292;
    break;
  case ImageFormatRg8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_659346;
    break;
  case ImageFormatR16ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_659352;
    break;
  case ImageFormatR8ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_65933a;
    break;
  case ImageFormatR64ui:
    this_local = (CompilerGLSL *)anon_var_dwarf_65939a;
    break;
  case ImageFormatR64i:
    this_local = (CompilerGLSL *)anon_var_dwarf_65938e;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::format_to_glsl(spv::ImageFormat format)
{
	if (options.es && is_desktop_only_format(format))
		SPIRV_CROSS_THROW("Attempting to use image format not supported in ES profile.");

	switch (format)
	{
	case ImageFormatRgba32f:
		return "rgba32f";
	case ImageFormatRgba16f:
		return "rgba16f";
	case ImageFormatR32f:
		return "r32f";
	case ImageFormatRgba8:
		return "rgba8";
	case ImageFormatRgba8Snorm:
		return "rgba8_snorm";
	case ImageFormatRg32f:
		return "rg32f";
	case ImageFormatRg16f:
		return "rg16f";
	case ImageFormatRgba32i:
		return "rgba32i";
	case ImageFormatRgba16i:
		return "rgba16i";
	case ImageFormatR32i:
		return "r32i";
	case ImageFormatRgba8i:
		return "rgba8i";
	case ImageFormatRg32i:
		return "rg32i";
	case ImageFormatRg16i:
		return "rg16i";
	case ImageFormatRgba32ui:
		return "rgba32ui";
	case ImageFormatRgba16ui:
		return "rgba16ui";
	case ImageFormatR32ui:
		return "r32ui";
	case ImageFormatRgba8ui:
		return "rgba8ui";
	case ImageFormatRg32ui:
		return "rg32ui";
	case ImageFormatRg16ui:
		return "rg16ui";
	case ImageFormatR11fG11fB10f:
		return "r11f_g11f_b10f";
	case ImageFormatR16f:
		return "r16f";
	case ImageFormatRgb10A2:
		return "rgb10_a2";
	case ImageFormatR8:
		return "r8";
	case ImageFormatRg8:
		return "rg8";
	case ImageFormatR16:
		return "r16";
	case ImageFormatRg16:
		return "rg16";
	case ImageFormatRgba16:
		return "rgba16";
	case ImageFormatR16Snorm:
		return "r16_snorm";
	case ImageFormatRg16Snorm:
		return "rg16_snorm";
	case ImageFormatRgba16Snorm:
		return "rgba16_snorm";
	case ImageFormatR8Snorm:
		return "r8_snorm";
	case ImageFormatRg8Snorm:
		return "rg8_snorm";
	case ImageFormatR8ui:
		return "r8ui";
	case ImageFormatRg8ui:
		return "rg8ui";
	case ImageFormatR16ui:
		return "r16ui";
	case ImageFormatRgb10a2ui:
		return "rgb10_a2ui";
	case ImageFormatR8i:
		return "r8i";
	case ImageFormatRg8i:
		return "rg8i";
	case ImageFormatR16i:
		return "r16i";
	case ImageFormatR64i:
		return "r64i";
	case ImageFormatR64ui:
		return "r64ui";
	default:
	case ImageFormatUnknown:
		return nullptr;
	}
}